

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UpsampleLayerParams::SerializeWithCachedSizes
          (UpsampleLayerParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  unsigned_long *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong value;
  ulong uVar9;
  int index;
  uint uVar10;
  float *a;
  
  if (0 < (this->scalingfactor_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar10 = this->_scalingfactor_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar7 = (byte)uVar10 | 0x80;
          uVar8 = uVar10 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar10;
          uVar10 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->scalingfactor_).current_size_;
  if (0 < iVar5) {
    index = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->scalingfactor_,index);
      value = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar7 = pbVar1;
        uVar9 = value;
        if (0x7f < value) {
          do {
            *pbVar7 = (byte)value | 0x80;
            uVar9 = value >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < value;
            value = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      index = index + 1;
    } while (index != iVar5);
  }
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(5,this->mode_,output);
  }
  if (this->linearupsamplemode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(6,this->linearupsamplemode_,output);
  }
  if ((this->fractionalscalingfactor_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x3a);
  }
  else {
    *output->buffer_ = ':';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  uVar10 = this->_fractionalscalingfactor_cached_byte_size_;
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar7 = pbVar1;
    uVar8 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar7 = (byte)uVar10 | 0x80;
        uVar8 = uVar10 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar3);
    }
    *pbVar7 = (byte)uVar8;
    iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  pRVar2 = (this->fractionalscalingfactor_).rep_;
  a = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    a = (float *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteFloatArray
            (a,(this->fractionalscalingfactor_).current_size_,output);
  return;
}

Assistant:

void UpsampleLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UpsampleLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 scalingFactor = 1;
  if (this->scalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalingfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->scalingfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->scalingfactor(i), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->mode(), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->linearupsamplemode(), output);
  }

  // repeated float fractionalScalingFactor = 7;
  if (this->fractionalscalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_fractionalscalingfactor_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->fractionalscalingfactor().data(), this->fractionalscalingfactor_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UpsampleLayerParams)
}